

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m256v_basic.c
# Opt level: O1

_Bool test_copy(void)

{
  uint n_row;
  uint n_col;
  long lVar1;
  ulong uVar2;
  bool bVar3;
  int iVar4;
  ulong uVar5;
  uint8_t *puVar6;
  long lVar7;
  long lVar8;
  ulong uVar9;
  uint8_t *puVar10;
  uint8_t *puVar11;
  size_t sVar12;
  size_t sVar13;
  uint uVar14;
  ulong uVar15;
  ulong uVar16;
  uint8_t auStack_90 [8];
  undefined1 local_88 [8];
  m256v B;
  m256v A;
  int ir;
  
  lVar8 = 0;
  do {
    n_row = (&DAT_00104690)[lVar8];
    uVar9 = 1;
    if (1 < (int)n_row) {
      uVar9 = (ulong)n_row;
    }
    lVar7 = 0;
    do {
      n_col = (&DAT_001046b0)[lVar7];
      uVar14 = n_col * n_row;
      uVar5 = (ulong)uVar14 + 0xf & 0xfffffffffffffff0;
      lVar1 = -uVar5;
      puVar6 = local_88 + lVar1;
      if (0 < (int)uVar14) {
        uVar15 = 0;
        do {
          puVar10 = auStack_90 + lVar1;
          builtin_memcpy(auStack_90 + lVar1,"P\x1d\x10",4);
          puVar10[4] = '\0';
          puVar10[5] = '\0';
          puVar10[6] = '\0';
          puVar10[7] = '\0';
          iVar4 = rand();
          puVar6[uVar15] = (uint8_t)iVar4;
          uVar15 = uVar15 + 1;
        } while (uVar14 != uVar15);
      }
      puVar11 = auStack_90 + lVar1;
      builtin_memcpy(auStack_90 + lVar1,"s\x1d\x10",4);
      puVar11[4] = '\0';
      puVar11[5] = '\0';
      puVar11[6] = '\0';
      puVar11[7] = '\0';
      m256v_make((m256v *)&B.e,n_row,n_col,puVar6);
      puVar6 = puVar6 + -uVar5;
      puVar6[-8] = 0x8f;
      puVar6[-7] = '\x1d';
      puVar6[-6] = '\x10';
      puVar6[-5] = '\0';
      puVar6[-4] = '\0';
      puVar6[-3] = '\0';
      puVar6[-2] = '\0';
      puVar6[-1] = '\0';
      m256v_make((m256v *)local_88,n_row,n_col,puVar6);
      puVar6[-8] = 0x9b;
      puVar6[-7] = '\x1d';
      puVar6[-6] = '\x10';
      puVar6[-5] = '\0';
      puVar6[-4] = '\0';
      puVar6[-3] = '\0';
      puVar6[-2] = '\0';
      puVar6[-1] = '\0';
      m256v_copy((m256v *)&B.e,(m256v *)local_88);
      uVar5 = 1;
      if (1 < (int)n_col) {
        uVar5 = (ulong)n_col;
      }
      uVar15 = 0;
      sVar12 = B.rstride;
      sVar13 = A.rstride;
      do {
        bVar3 = true;
        if (*(char *)(A.rstride + A._0_8_ * uVar15) == *(char *)(B.rstride + B._0_8_ * uVar15)) {
          uVar2 = 1;
          do {
            uVar16 = uVar2;
            if (uVar5 == uVar16) break;
            uVar2 = uVar16 + 1;
          } while (*(char *)(sVar13 + uVar16) == *(char *)(sVar12 + uVar16));
          bVar3 = (long)uVar16 < (long)(int)n_col;
        }
        if (bVar3 != false) break;
        uVar15 = uVar15 + 1;
        sVar13 = sVar13 + A._0_8_;
        sVar12 = sVar12 + B._0_8_;
      } while (uVar15 != uVar9);
      lVar7 = lVar7 + 1;
    } while ((lVar7 == 6 | bVar3) != 1);
    lVar8 = lVar8 + 1;
    if ((lVar8 == 6 | bVar3) == 1) {
      return (_Bool)(bVar3 ^ 1);
    }
  } while( true );
}

Assistant:

static bool test_copy()
{
	const int nrow[] = { 1, 2, 3, 5, 9, 10 };
	const int ncol[] = { 1, 2, 3, 7, 8, 10 };
	for (int ir = 0; ir < array_size(nrow); ++ir) {
		const int nr = nrow[ir];
		for (int ic = 0; ic < array_size(ncol); ++ic) {
			const int nc = ncol[ic];

			Def_mat256_rand(A, a, nr, nc, 0xff)
			m256v_Def(B, b, nr, nc);
			m256v_copy(&A, &B);

			for (int r = 0; r < nr; ++r) {
				for (int c = 0; c < nc; ++c) {
					if (m256v_get_el(&A, r, c)
					   != m256v_get_el(&B, r, c))
					{
						return false;
					}
				}
			}
		}
	}

	return true;
}